

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int ptls_tls12_phash(ptls_hash_algorithm_t *algo,void *output,size_t outlen,ptls_iovec_t secret,
                    char *label,ptls_iovec_t seed)

{
  _func_void_st_ptls_hash_context_t_ptr_void_ptr_size_t *p_Var1;
  code *pcVar2;
  undefined8 uVar3;
  ptls_hash_context_t *ppVar4;
  size_t sVar5;
  long local_90;
  size_t output_off;
  uint8_t An [64];
  ptls_hash_context_t *hmac;
  char *label_local;
  size_t outlen_local;
  void *output_local;
  ptls_hash_algorithm_t *algo_local;
  ptls_iovec_t secret_local;
  
  local_90 = 0;
  ppVar4 = ptls_hmac_create(algo,secret.base,secret.len);
  if (ppVar4 == (ptls_hash_context_t *)0x0) {
    secret_local.len._4_4_ = 0x201;
  }
  else {
    An._56_8_ = ppVar4;
    if (label != (char *)0x0) {
      p_Var1 = ppVar4->update;
      sVar5 = strlen(label);
      (*p_Var1)(ppVar4,label,sVar5);
    }
    (**(code **)An._56_8_)(An._56_8_,seed.base,seed.len);
    (**(code **)(An._56_8_ + 8))(An._56_8_,&output_off,1);
    while( true ) {
      (**(code **)An._56_8_)(An._56_8_,&output_off,algo->digest_size);
      uVar3 = An._56_8_;
      if (label != (char *)0x0) {
        pcVar2 = *(code **)An._56_8_;
        sVar5 = strlen(label);
        (*pcVar2)(uVar3,label,sVar5);
      }
      (**(code **)An._56_8_)(An._56_8_,seed.base,seed.len);
      if (outlen - local_90 <= algo->digest_size) break;
      (**(code **)(An._56_8_ + 8))(An._56_8_,(long)output + local_90,1);
      local_90 = algo->digest_size + local_90;
      (**(code **)An._56_8_)(An._56_8_,&output_off,algo->digest_size);
      (**(code **)(An._56_8_ + 8))(An._56_8_,&output_off,1);
    }
    (**(code **)(An._56_8_ + 8))(An._56_8_,&output_off,0);
    memcpy((void *)((long)output + local_90),&output_off,outlen - local_90);
    (*ptls_clear_memory)(&output_off,algo->digest_size);
    secret_local.len._4_4_ = 0;
  }
  return secret_local.len._4_4_;
}

Assistant:

int ptls_tls12_phash(ptls_hash_algorithm_t *algo, void *output, size_t outlen, ptls_iovec_t secret, const char *label,
                     ptls_iovec_t seed)
{
    ptls_hash_context_t *hmac;
    uint8_t An[PTLS_MAX_DIGEST_SIZE];
    size_t output_off = 0;

    if ((hmac = ptls_hmac_create(algo, secret.base, secret.len)) == NULL)
        return PTLS_ERROR_NO_MEMORY;

    /* A(1) = HMAC_hash(secret, label + seed) */
    if (label != NULL)
        hmac->update(hmac, label, strlen(label));
    hmac->update(hmac, seed.base, seed.len);
    hmac->final(hmac, An, PTLS_HASH_FINAL_MODE_RESET);

    while (1) {
        /* output += HMAC_hash(secret, A(i) + label + seed) */
        hmac->update(hmac, An, algo->digest_size);
        if (label != NULL)
            hmac->update(hmac, label, strlen(label));
        hmac->update(hmac, seed.base, seed.len);
        if (outlen - output_off <= algo->digest_size) {
            /* digest of last chunk is at first written to An then the necessary bytes are copied to output */
            hmac->final(hmac, An, PTLS_HASH_FINAL_MODE_FREE);
            memcpy((uint8_t *)output + output_off, An, outlen - output_off);
            break;
        }
        hmac->final(hmac, (uint8_t *)output + output_off, PTLS_HASH_FINAL_MODE_RESET);
        output_off += algo->digest_size;

        /* A(i) = HMAC_hash(secret, A(i-1)) */
        hmac->update(hmac, An, algo->digest_size);
        hmac->final(hmac, An, PTLS_HASH_FINAL_MODE_RESET);
    }

    ptls_clear_memory(An, algo->digest_size);

    return 0;
}